

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_set.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalSet *op)

{
  reference this_00;
  type op_00;
  PhysicalOperator *pPVar1;
  PhysicalOperator *pPVar2;
  reference_wrapper<duckdb::PhysicalOperator> local_20;
  
  if ((op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    pPVar1 = CreatePlan(this,op_00);
    pPVar2 = Make<duckdb::PhysicalSetVariable,std::__cxx11::string,unsigned_long&>
                       (this,&op->name,&(op->super_LogicalOperator).estimated_cardinality);
    local_20._M_data = pPVar1;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar2->children,&local_20);
    return pPVar2;
  }
  pPVar1 = Make<duckdb::PhysicalSet,std::__cxx11::string&,duckdb::Value&,duckdb::SetScope&,unsigned_long&>
                     (this,&op->name,&op->value,&op->scope,
                      &(op->super_LogicalOperator).estimated_cardinality);
  return pPVar1;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalSet &op) {
	// Set a config setting.
	if (op.children.empty()) {
		return Make<PhysicalSet>(op.name, op.value, op.scope, op.estimated_cardinality);
	}

	// Set a variable.
	auto &plan = CreatePlan(*op.children[0]);
	auto &set_variable = Make<PhysicalSetVariable>(std::move(op.name), op.estimated_cardinality);
	set_variable.children.push_back(plan);
	return set_variable;
}